

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O1

size_t duckdb_zstd::FSE_compress_usingCTable_generic
                 (void *dst,size_t dstSize,void *src,size_t srcSize,FSE_CTable *ct,uint fast)

{
  byte *pbVar1;
  ulong *puVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong *puVar9;
  size_t sVar10;
  uint uVar11;
  ulong uVar12;
  ulong *puVar13;
  ushort uVar14;
  BYTE *istart;
  long lVar15;
  ushort uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  
  if ((2 < srcSize) && (8 < dstSize)) {
    puVar2 = (ulong *)((long)dst + (dstSize - 8));
    uVar22 = (ulong)*(byte *)((long)src + (srcSize - 1));
    uVar3 = (ushort)*ct;
    lVar15 = 1;
    if (uVar3 != 0) {
      lVar15 = (long)(1 << ((char)uVar3 - 1U & 0x1f));
    }
    uVar6 = ct[lVar15 + uVar22 * 2 + 2] + 0x8000;
    uVar4 = *(ushort *)
             ((long)ct +
             (long)(int)ct[lVar15 + uVar22 * 2 + 1] * 2 +
             (ulong)((uVar6 & 0xffff0000) - ct[lVar15 + uVar22 * 2 + 2] >>
                    ((byte)(uVar6 >> 0x10) & 0x3f)) * 2 + 4);
    if ((srcSize & 1) == 0) {
      uVar22 = (ulong)*(byte *)((long)src + (srcSize - 2));
      pvVar23 = (void *)((long)src + (srcSize - 2));
      uVar6 = ct[lVar15 + uVar22 * 2 + 2] + 0x8000;
      uVar14 = *(ushort *)
                ((long)ct +
                (long)(int)ct[lVar15 + uVar22 * 2 + 1] * 2 +
                (ulong)((uVar6 & 0xffff0000) - ct[lVar15 + uVar22 * 2 + 2] >>
                       ((byte)(uVar6 >> 0x10) & 0x3f)) * 2 + 4);
      uVar22 = 0;
      uVar6 = 0;
      puVar13 = (ulong *)dst;
      uVar16 = uVar4;
    }
    else {
      uVar22 = (ulong)*(byte *)((long)src + (srcSize - 2));
      uVar6 = ct[lVar15 + uVar22 * 2 + 2] + 0x8000;
      uVar16 = *(ushort *)
                ((long)ct +
                (long)(int)ct[lVar15 + uVar22 * 2 + 1] * 2 +
                (ulong)((uVar6 & 0xffff0000) - ct[lVar15 + uVar22 * 2 + 2] >>
                       ((byte)(uVar6 >> 0x10) & 0x3f)) * 2 + 4);
      uVar17 = (ulong)*(byte *)((long)src + (srcSize - 3));
      uVar22 = (ulong)ct[lVar15 + uVar17 * 2 + 2] + (ulong)uVar4;
      uVar11 = *(uint *)(BIT_mask + (uVar22 >> 0x10) * 4) & (uint)uVar4;
      uVar6 = (uint)(uVar22 >> 0x10);
      pvVar23 = (void *)((long)src + (srcSize - 3));
      uVar14 = *(ushort *)
                ((long)ct +
                (long)(int)ct[lVar15 + uVar17 * 2 + 1] * 2 +
                (ulong)(uVar4 >> ((byte)(uVar22 >> 0x10) & 0x3f)) * 2 + 4);
      puVar13 = (ulong *)((long)dst + (uVar22 >> 0x13));
      *(ulong *)dst = (ulong)uVar11;
      iVar5 = (int)(uVar22 >> 0x13);
      if (fast == 0) {
        if (puVar2 < puVar13) {
          puVar13 = puVar2;
        }
        uVar6 = uVar6 & 7;
        uVar22 = (ulong)(uVar11 >> ((byte)(iVar5 << 3) & 0x3f));
      }
      else {
        uVar6 = uVar6 & 7;
        uVar22 = (ulong)(uVar11 >> ((byte)(iVar5 << 3) & 0x3f));
      }
    }
    uVar17 = (ulong)uVar16;
    uVar19 = (ulong)uVar14;
    if ((srcSize & 2) == 0) {
      uVar18 = ct[lVar15 + (ulong)*(byte *)((long)pvVar23 - 1) * 2 + 2] + uVar17;
      iVar5 = uVar6 + (int)(uVar18 >> 0x10);
      uVar17 = (ulong)*(ushort *)
                       ((long)ct +
                       (long)(int)ct[lVar15 + (ulong)*(byte *)((long)pvVar23 - 1) * 2 + 1] * 2 +
                       (ulong)(uVar16 >> ((byte)(uVar18 >> 0x10) & 0x3f)) * 2 + 4);
      pbVar1 = (byte *)((long)pvVar23 - 2);
      uVar19 = ct[lVar15 + (ulong)*pbVar1 * 2 + 2] + uVar19;
      pvVar23 = (void *)((long)pvVar23 - 2);
      uVar22 = (ulong)(*(uint *)(BIT_mask + (uVar19 >> 0x10) * 4) & (uint)uVar14) <<
               ((byte)iVar5 & 0x3f) |
               (ulong)(*(uint *)(BIT_mask + (uVar18 >> 0x10) * 4) & (uint)uVar16) << (sbyte)uVar6 |
               uVar22;
      uVar6 = iVar5 + (int)(uVar19 >> 0x10);
      uVar19 = (ulong)*(ushort *)
                       ((long)ct +
                       (long)(int)ct[lVar15 + (ulong)*pbVar1 * 2 + 1] * 2 +
                       (ulong)(uVar14 >> ((byte)(uVar19 >> 0x10) & 0x3f)) * 2 + 4);
      uVar11 = uVar6 >> 3;
      puVar9 = (ulong *)((long)puVar13 + (ulong)uVar11);
      *puVar13 = uVar22;
      puVar13 = puVar9;
      if (fast == 0) {
        if (puVar2 < puVar9) {
          puVar13 = puVar2;
        }
        uVar6 = uVar6 & 7;
        uVar22 = uVar22 >> ((byte)(uVar11 << 3) & 0x3f);
      }
      else {
        uVar6 = uVar6 & 7;
        uVar22 = uVar22 >> ((byte)(uVar11 << 3) & 0x3f);
      }
    }
    while( true ) {
      if (pvVar23 <= src) break;
      uVar18 = ct[lVar15 + (ulong)*(byte *)((long)pvVar23 - 1) * 2 + 2] + uVar17;
      iVar5 = uVar6 + (int)(uVar18 >> 0x10);
      uVar4 = *(ushort *)
               ((long)ct +
               (long)(int)ct[lVar15 + (ulong)*(byte *)((long)pvVar23 - 1) * 2 + 1] * 2 +
               (uVar17 >> ((byte)(uVar18 >> 0x10) & 0x3f)) * 2 + 4);
      uVar12 = ct[lVar15 + (ulong)*(byte *)((long)pvVar23 - 2) * 2 + 2] + uVar19;
      iVar7 = iVar5 + (int)(uVar12 >> 0x10);
      uVar14 = *(ushort *)
                ((long)ct +
                (long)(int)ct[lVar15 + (ulong)*(byte *)((long)pvVar23 - 2) * 2 + 1] * 2 +
                (uVar19 >> ((byte)(uVar12 >> 0x10) & 0x3f)) * 2 + 4);
      uVar20 = (ulong)ct[lVar15 + (ulong)*(byte *)((long)pvVar23 - 3) * 2 + 2] + (ulong)uVar4;
      iVar8 = iVar7 + (int)(uVar20 >> 0x10);
      pbVar1 = (byte *)((long)pvVar23 - 4);
      uVar21 = (ulong)ct[lVar15 + (ulong)*pbVar1 * 2 + 2] + (ulong)uVar14;
      uVar22 = (ulong)((uint)uVar14 & *(uint *)(BIT_mask + (uVar21 >> 0x10) * 4)) <<
               ((byte)iVar8 & 0x3f) |
               (ulong)((uint)uVar4 & *(uint *)(BIT_mask + (uVar20 >> 0x10) * 4)) <<
               ((byte)iVar7 & 0x3f) |
               (ulong)(*(uint *)(BIT_mask + (uVar12 >> 0xe & 0x3fffffffc)) & (uint)uVar19) <<
               ((byte)iVar5 & 0x3f) |
               (ulong)(*(uint *)(BIT_mask + (uVar18 >> 0xe & 0x3fffffffc)) & (uint)uVar17) <<
               (sbyte)uVar6 | uVar22;
      uVar6 = (int)(uVar21 >> 0x10) + iVar8;
      uVar17 = (ulong)*(ushort *)
                       ((long)ct +
                       (long)(int)ct[lVar15 + (ulong)*(byte *)((long)pvVar23 - 3) * 2 + 1] * 2 +
                       (ulong)(uVar4 >> ((byte)(uVar20 >> 0x10) & 0x3f)) * 2 + 4);
      pvVar23 = (void *)((long)pvVar23 - 4);
      uVar19 = (ulong)*(ushort *)
                       ((long)ct +
                       (long)(int)ct[lVar15 + (ulong)*pbVar1 * 2 + 1] * 2 +
                       (ulong)(uVar14 >> ((byte)(uVar21 >> 0x10) & 0x3f)) * 2 + 4);
      puVar9 = (ulong *)((ulong)(uVar6 >> 3) + (long)puVar13);
      *puVar13 = uVar22;
      puVar13 = puVar9;
      if (puVar2 < puVar9) {
        puVar13 = puVar2;
      }
      if (fast != 0) {
        puVar13 = puVar9;
      }
      uVar22 = uVar22 >> ((byte)uVar6 & 0x38);
      uVar6 = uVar6 & 7;
    }
    uVar22 = (ulong)((uint)uVar17 & *(uint *)(BIT_mask + (ulong)uVar3 * 4)) << (sbyte)uVar6 | uVar22
    ;
    uVar6 = uVar6 + uVar3;
    puVar9 = (ulong *)((ulong)(uVar6 >> 3) + (long)puVar13);
    if (puVar2 < puVar9) {
      puVar9 = puVar2;
    }
    *puVar13 = uVar22;
    uVar22 = (ulong)((uint)uVar19 & *(uint *)(BIT_mask + (ulong)uVar3 * 4)) << (sbyte)(uVar6 & 7) |
             uVar22 >> ((byte)uVar6 & 0x38);
    uVar6 = (uVar6 & 7) + (uint)uVar3;
    *puVar9 = uVar22;
    puVar9 = (ulong *)((ulong)(uVar6 >> 3) + (long)puVar9);
    if (puVar2 < puVar9) {
      puVar9 = puVar2;
    }
    uVar11 = (uVar6 & 7) + 1;
    puVar13 = (ulong *)((ulong)(uVar11 >> 3) + (long)puVar9);
    if (puVar2 < puVar13) {
      puVar13 = puVar2;
    }
    *puVar9 = uVar22 >> ((byte)uVar6 & 0x38) | 1L << (uVar6 & 7);
    sVar10 = 0;
    if (puVar13 < puVar2) {
      sVar10 = (long)puVar13 - ((long)dst + ((ulong)((uVar11 & 7) == 0) - 1));
    }
    return sVar10;
  }
  return 0;
}

Assistant:

static size_t FSE_compress_usingCTable_generic (void* dst, size_t dstSize,
                           const void* src, size_t srcSize,
                           const FSE_CTable* ct, const unsigned fast)
{
    const BYTE* const istart = (const BYTE*) src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip=iend;

    BIT_CStream_t bitC;
    FSE_CState_t CState1, CState2;

    /* init */
    if (srcSize <= 2) return 0;
    { size_t const initError = BIT_initCStream(&bitC, dst, dstSize);
      if (FSE_isError(initError)) return 0; /* not enough space available to write a bitstream */ }

#define FSE_FLUSHBITS(s)  (fast ? BIT_flushBitsFast(s) : BIT_flushBits(s))

    if (srcSize & 1) {
        FSE_initCState2(&CState1, ct, *--ip);
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    } else {
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_initCState2(&CState1, ct, *--ip);
    }

    /* join to mod 4 */
    srcSize -= 2;
    if ((sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) && (srcSize & 2)) {  /* test bit 2 */
        FSE_encodeSymbol(&bitC, &CState2, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    }

    /* 2 or 4 encoding per loop */
    while ( ip>istart ) {

        FSE_encodeSymbol(&bitC, &CState2, *--ip);

        if (sizeof(bitC.bitContainer)*8 < FSE_MAX_TABLELOG*2+7 )   /* this test must be static */
            FSE_FLUSHBITS(&bitC);

        FSE_encodeSymbol(&bitC, &CState1, *--ip);

        if (sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) {  /* this test must be static */
            FSE_encodeSymbol(&bitC, &CState2, *--ip);
            FSE_encodeSymbol(&bitC, &CState1, *--ip);
        }

        FSE_FLUSHBITS(&bitC);
    }

    FSE_flushCState(&bitC, &CState2);
    FSE_flushCState(&bitC, &CState1);
    return BIT_closeCStream(&bitC);
}